

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int saveCursorPosition(BtCursor *pCur)

{
  int iVar1;
  uchar *pBuf;
  
  if (pCur->eState == '\x02') {
    pCur->eState = '\x01';
  }
  else {
    pCur->skipNext = 0;
  }
  sqlite3BtreeKeySize(pCur,&pCur->nKey);
  if (pCur->apPage[0]->intKey == '\0') {
    pBuf = (uchar *)sqlite3Malloc(pCur->nKey);
    if (pBuf == (uchar *)0x0) {
      iVar1 = 7;
      goto LAB_001265b2;
    }
    iVar1 = accessPayload(pCur,0,(u32)pCur->nKey,pBuf,0);
    if (iVar1 != 0) {
      sqlite3_free(pBuf);
      goto LAB_001265b2;
    }
    pCur->pKey = pBuf;
  }
  btreeReleaseAllCursorPages(pCur);
  pCur->eState = '\x03';
  iVar1 = 0;
LAB_001265b2:
  pCur->curFlags = pCur->curFlags & 0xfb;
  return iVar1;
}

Assistant:

static int saveCursorPosition(BtCursor *pCur){
  int rc;

  assert( CURSOR_VALID==pCur->eState || CURSOR_SKIPNEXT==pCur->eState );
  assert( 0==pCur->pKey );
  assert( cursorHoldsMutex(pCur) );

  if( pCur->eState==CURSOR_SKIPNEXT ){
    pCur->eState = CURSOR_VALID;
  }else{
    pCur->skipNext = 0;
  }
  rc = sqlite3BtreeKeySize(pCur, &pCur->nKey);
  assert( rc==SQLITE_OK );  /* KeySize() cannot fail */

  /* If this is an intKey table, then the above call to BtreeKeySize()
  ** stores the integer key in pCur->nKey. In this case this value is
  ** all that is required. Otherwise, if pCur is not open on an intKey
  ** table, then malloc space for and store the pCur->nKey bytes of key 
  ** data.
  */
  if( 0==pCur->apPage[0]->intKey ){
    void *pKey = sqlite3Malloc( pCur->nKey );
    if( pKey ){
      rc = sqlite3BtreeKey(pCur, 0, (int)pCur->nKey, pKey);
      if( rc==SQLITE_OK ){
        pCur->pKey = pKey;
      }else{
        sqlite3_free(pKey);
      }
    }else{
      rc = SQLITE_NOMEM;
    }
  }
  assert( !pCur->apPage[0]->intKey || !pCur->pKey );

  if( rc==SQLITE_OK ){
    btreeReleaseAllCursorPages(pCur);
    pCur->eState = CURSOR_REQUIRESEEK;
  }

  invalidateOverflowCache(pCur);
  return rc;
}